

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O0

double calcScore(int *bins,int bincount,int keycount)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double dVar1;
  undefined1 auVar3 [16];
  double dVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double f;
  double b;
  int i;
  double r;
  double k;
  double n;
  undefined4 local_2c;
  undefined8 local_28;
  
  dVar1 = (double)in_ESI;
  auVar4._0_8_ = (double)in_EDX;
  local_28 = 0.0;
  for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
    auVar3._0_8_ = (double)*(int *)(in_RDI + (long)local_2c * 4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar3._0_8_;
    auVar3._8_8_ = 0;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_28;
    auVar6 = vfmadd213sd_fma(auVar3,auVar5,auVar8);
    local_28 = auVar6._0_8_;
  }
  dVar2 = sqrt(local_28 / dVar1);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar4._0_8_;
  auVar4._8_8_ = 0;
  auVar6 = vfmadd213sd_fma(auVar4,auVar6,ZEXT816(0xbff0000000000000));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar1 * dVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = -auVar4._0_8_;
  auVar4 = vfmadd213sd_fma(auVar7,auVar9,auVar10);
  return 1.0 - (auVar6._0_8_ / auVar4._0_8_) / dVar1;
}

Assistant:

double calcScore ( const int * bins, const int bincount, const int keycount )
{
  double n = bincount;
  double k = keycount;

  // compute rms value

  double r = 0;

  for(int i = 0; i < bincount; i++)
  {
    double b = bins[i];

    r += b*b;
  }

  r = sqrt(r / n);

  // compute fill factor

  double f = (k*k - 1) / (n*r*r - k);

  // rescale to (0,1) with 0 = good, 1 = bad

  return 1 - (f / n);
}